

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroString_Test<absl::lts_20250127::Cord>::
TestBody(NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroString_Test<absl::lts_20250127::Cord>
         *this)

{
  bool bVar1;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pMVar2
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs;
  char *pcVar3;
  pointer *__ptr_2;
  char *in_R9;
  pointer *__ptr;
  pointer *__ptr_4;
  Cord *output;
  string_view data;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__2;
  TestAllMapTypes rt_msg;
  TestAllMapTypes msg;
  AssertHelper local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  undefined1 local_248 [8];
  undefined1 local_240 [24];
  AssertHelper local_228;
  vector<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_220;
  AssertHelper local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0 [200];
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  undefined1 local_108 [32];
  Eq2Matcher local_e8 [184];
  
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
            ((TestAllMapTypes *)local_108,(Arena *)0x0);
  pMVar2 = protobuf::internal::
           TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::MutableMap((TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(local_108 + 0x10));
  local_248._0_4_ = 0;
  Map<int,std::__cxx11::string>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
              *)local_200,pMVar2,(int *)local_248);
  pcVar3 = anon_var_dwarf_a12c75 + 5;
  pMVar2 = (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(anon_var_dwarf_a12c75 + 5);
  std::__cxx11::string::_M_replace
            ((ulong)(local_200._0_8_ + 0x10),0,(char *)((NodeBase *)(local_200._0_8_ + 0x18))->next,
             0x1141ae9);
  output = &(this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>).value_;
  bVar1 = MessageLite::SerializeToString((MessageLite *)local_108,output);
  local_248[0] = (internal)bVar1;
  local_240._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_200,(internal *)local_248,
               (AssertionResult *)"TestSerialize(msg, &output_sink)","false","true",in_R9);
    pMVar2 = (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x399;
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x399,(char *)local_200._0_8_);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if ((NodeBase *)local_200._0_8_ != (NodeBase *)local_1f0) {
      operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
    }
    if ((long *)CONCAT44(local_228.data_._4_4_,(Flags)local_228.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_228.data_._4_4_,(Flags)local_228.data_) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_240._0_8_);
    }
    if (!bVar1) goto LAB_008ab9ed;
  }
  absl::lts_20250127::Cord::operator_cast_to_string((string *)local_200,output);
  local_248[0] = (internal)((UntypedMapBase *)local_200._8_8_ != (UntypedMapBase *)0x0);
  local_240._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((NodeBase *)local_200._0_8_ != (NodeBase *)local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
  }
  if (local_248[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_200,(internal *)local_248,
               (AssertionResult *)"this->GetOutput().empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x39b,(char *)local_200._0_8_);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if ((NodeBase *)local_200._0_8_ != (NodeBase *)local_1f0) {
      operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
    }
    if ((long *)CONCAT44(local_228.data_._4_4_,(Flags)local_228.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_228.data_._4_4_,(Flags)local_228.data_) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_240._0_8_);
    }
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_240._0_8_);
    }
    proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
              ((TestAllMapTypes *)local_200,(Arena *)0x0);
    absl::lts_20250127::Cord::operator_cast_to_string((string *)local_248,output);
    data._M_str._4_4_ = local_248._4_4_;
    data._M_str._0_4_ = local_248._0_4_;
    data._M_len = local_240._0_8_;
    bVar1 = MessageLite::ParseFromString((MessageLite *)local_200,data);
    local_228.data_._0_4_ = CONCAT31(local_228.data_._1_3_,bVar1);
    local_220.
    super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if ((undefined1 *)CONCAT44(local_248._4_4_,local_248._0_4_) != local_240 + 8) {
      operator_delete((undefined1 *)CONCAT44(local_248._4_4_,local_248._0_4_),local_240._8_8_ + 1);
    }
    if (local_228.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_258);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_248,(internal *)&local_228,
                 (AssertionResult *)"rt_msg.ParseFromString(this->GetOutput())","false","true",in_R9
                );
      pMVar2 = (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x39f;
      testing::internal::AssertHelper::AssertHelper
                (&local_208,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                 ,0x39f,(char *)CONCAT44(local_248._4_4_,local_248._0_4_));
      testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_258);
      testing::internal::AssertHelper::~AssertHelper(&local_208);
      if ((undefined1 *)CONCAT44(local_248._4_4_,local_248._0_4_) != local_240 + 8) {
        operator_delete((undefined1 *)CONCAT44(local_248._4_4_,local_248._0_4_),local_240._8_8_ + 1)
        ;
      }
      if ((long *)CONCAT71(local_258.data_._1_7_,(char)local_258.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_258.data_._1_7_,(char)local_258.data_) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_220.
        super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_220.
                   super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    }
    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)(local_108 + 0x10));
    testing::
    UnorderedPointwise<testing::internal::Eq2Matcher,google::protobuf::Map<int,std::__cxx11::string>>
              (&local_128,(testing *)&local_208,local_e8,pMVar2);
    local_220.
    super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_128.matchers_.
         super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_220.
    super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_128.matchers_.
         super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_220.
    super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_128.matchers_.
         super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_248._0_4_ = local_128.match_flags_;
    local_128.matchers_.
    super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.matchers_.
    super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.matchers_.
    super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228.data_._0_4_ = local_128.match_flags_;
    local_240._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_240._8_8_ = 0;
    local_240._16_8_ = 0;
    std::
    vector<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector((vector<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)local_240);
    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)local_1f0);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,std::pair<int_const,std::__cxx11::string>>>>
    ::operator()(&local_258,(char *)&local_228,
                 (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)"rt_msg.map_int32_bytes()");
    std::
    vector<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector(&local_220);
    std::
    vector<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector(&local_128.matchers_);
    if ((char)local_258.data_ == '\0') {
      testing::Message::Message((Message *)local_248);
      if (local_250 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_250->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                 ,0x3a1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_228,(Message *)local_248);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      if ((long *)CONCAT44(local_248._4_4_,local_248._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_248._4_4_,local_248._0_4_) + 8))();
      }
    }
    if (local_250 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_250,local_250);
    }
    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)local_1f0);
    local_228.data_._0_4_ = 0;
    rhs = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::at<int>((Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_1f0 + 0x10),(key_arg<int> *)&local_228);
    pcVar3 = anon_var_dwarf_a12c75 + 5;
    testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
              ((internal *)local_248,"\"\"","rt_msg.map_int32_bytes().at(0)",
               (char (*) [1])(anon_var_dwarf_a12c75 + 5),rhs);
    if (local_248[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_228);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((_Alloc_hider *)local_240._0_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                 ,0x3a5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_258,(Message *)&local_228);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      if ((long *)CONCAT44(local_228.data_._4_4_,(Flags)local_228.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_228.data_._4_4_,(Flags)local_228.data_) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_240._0_8_);
    }
    proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes((TestAllMapTypes *)local_200)
    ;
  }
LAB_008ab9ed:
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes((TestAllMapTypes *)local_108);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest, MapRoundTripZeroKeyZeroString) {
  TestAllMapTypes msg;
  (*msg.mutable_map_int32_bytes())[0] = "";

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  EXPECT_THAT(rt_msg.map_int32_bytes(),
              UnorderedPointwise(Eq(), msg.map_int32_bytes()));

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ("", rt_msg.map_int32_bytes().at(0));
}